

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDMMCAnalyzerResults.cpp
# Opt level: O3

void __thiscall
SDMMCAnalyzerResults::GenerateBubbleText
          (SDMMCAnalyzerResults *this,U64 frame_index,Channel *channel,DisplayBase display_base)

{
  long lVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  char str_arg [33];
  Frame frame;
  char str_stuff [33];
  char str_rca [33];
  char str_hpi [33];
  char str_cmd [33];
  char str_crc [8];
  char str_reg_data [33];
  char str_num_blocks [33];
  char **ppcVar7;
  char *local_398 [2];
  char local_388 [24];
  Frame local_370 [16];
  uint local_360;
  uint uStack_35c;
  uint local_358;
  uint uStack_354;
  undefined1 local_350;
  undefined1 local_34f;
  char local_348;
  undefined1 local_347;
  undefined1 local_346;
  undefined1 local_345;
  undefined1 local_344;
  undefined1 local_343;
  undefined1 local_342;
  char local_318 [48];
  byte local_2e8 [3];
  undefined1 local_2e5;
  char local_2b8 [48];
  char *local_288;
  long local_280;
  char local_278 [496];
  char *local_88 [6];
  char local_58 [48];
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)local_370);
  switch(local_350) {
  case 0:
    cVar2 = Channel::operator!=(channel,&this->mSettings->mCommandChannel);
    if (cVar2 != '\0') break;
    pcVar4 = "Card sending";
    if (CONCAT44(uStack_35c,local_360) == 1) {
      pcVar4 = "Host sending";
    }
    goto LAB_0010707f;
  case 1:
    cVar2 = Channel::operator!=(channel,&this->mSettings->mCommandChannel);
    if (cVar2 != '\0') break;
    AnalyzerHelpers::GetNumberString(CONCAT44(uStack_35c,local_360),Decimal,6,local_2b8,0x21);
    AnalyzerHelpers::GetNumberString
              (CONCAT44(uStack_354,local_358),display_base,0x20,(char *)local_398,0x21);
    SDMMCHelpers::MMCCommandDescription(local_360,local_358);
    AnalyzerResults::AddResultString
              ((char *)this,"CMD",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"CMD",local_2b8,(char *)0x0,(char *)0x0,(char *)0x0);
    ppcVar7 = local_398;
    AnalyzerResults::AddResultString((char *)this,"CMD",local_2b8,", arg=",(char *)ppcVar7,"  ");
    pcVar4 = cmd_abbrev_from_number(local_360);
    AnalyzerResults::AddResultString((char *)this,"CMD",local_2b8," (",pcVar4,"), arg=");
    uVar3 = local_358;
    lVar1 = CONCAT44(uStack_35c,local_360);
    if (0x26 < lVar1) {
      if (lVar1 < 0x37) {
        if (lVar1 - 0x35U < 2) {
          AnalyzerHelpers::GetNumberString
                    (((ulong)local_358 & 0xff0000) >> 0x10,display_base,0x20,local_318,0x21);
          AnalyzerHelpers::GetNumberString
                    (((ulong)uVar3 & 0xff00) >> 8,display_base,0x20,&local_348,0x21);
          AnalyzerHelpers::GetNumberString
                    ((ulong)uVar3 & 0xff,display_base,0x20,(char *)local_2e8,0x21);
          pcVar4 = ", arg=%s, sec_specific=%s, sec_protocol=%s, reserv=%s";
        }
        else {
          if (lVar1 != 0x27) goto switchD_00106cfc_caseD_2;
          uVar5 = CONCAT44(uStack_354,local_358);
          AnalyzerHelpers::GetNumberString
                    ((ulong)((uint)(uVar5 >> 0x10) & 0xff),display_base,0x20,local_318,0x21);
          AnalyzerHelpers::GetNumberString
                    ((ulong)((uint)(uVar5 >> 0xf) & 0xf),display_base,4,&local_348,0x21);
          AnalyzerHelpers::GetNumberString
                    ((ulong)((uint)(uVar5 >> 8) & 0xff),display_base,0x20,(char *)local_2e8,0x21);
          ppcVar7 = local_88;
          AnalyzerHelpers::GetNumberString
                    ((ulong)uVar3 & 0xff,display_base,0x20,(char *)ppcVar7,0x21);
          pcVar4 = ", arg=%s, rca=%s, reg_wflag=%s, reg_addr=%s, reg_data=%s";
        }
        goto LAB_00107618;
      }
      if (lVar1 == 0x37) goto switchD_00106ed3_caseD_3;
      if (lVar1 == 0x38) {
        AnalyzerHelpers::GetNumberString
                  (((ulong)local_358 & 0x1fe) >> 1,display_base,0x20,local_318,0x21);
        AnalyzerHelpers::GetNumberString((ulong)(uVar3 & 0xf),display_base,4,&local_348,0x21);
        pcVar4 = ", arg=%s, stuff=%s, rd_wr1=%s";
        goto LAB_001071c9;
      }
      goto switchD_00106cfc_caseD_2;
    }
    switch(lVar1) {
    case 3:
    case 7:
    case 9:
    case 10:
    case 0xf:
switchD_00106ed3_caseD_3:
      AnalyzerHelpers::GetNumberString
                (((ulong)local_358 & 0xff0000) >> 0x10,display_base,0x20,local_318,0x21);
      AnalyzerHelpers::GetNumberString((ulong)uVar3 & 0xff,display_base,0x20,&local_348,0x21);
      pcVar4 = ", arg=%s, rca=%s, stuff=%s";
      goto LAB_001071c9;
    case 4:
      AnalyzerHelpers::GetNumberString
                (((ulong)local_358 & 0xff0000) >> 0x10,display_base,0x20,local_318,0x21);
      AnalyzerHelpers::GetNumberString((ulong)uVar3 & 0xff,display_base,0x20,&local_348,0x21);
      pcVar4 = ", arg=%s, dsr=%s, stuff=%s";
LAB_001071c9:
      sprintf((char *)&local_288,pcVar4,local_398,local_318);
      break;
    case 5:
      uVar5 = CONCAT44(uStack_354,local_358);
      AnalyzerHelpers::GetNumberString
                (((ulong)local_358 & 0xff0000) >> 0x10,display_base,0x20,local_318,0x21);
      AnalyzerHelpers::GetNumberString
                ((ulong)((uint)(uVar5 >> 0xf) & 0xf),display_base,4,&local_348,0x21);
      AnalyzerHelpers::GetNumberString((ulong)uVar3 & 0xff,display_base,0x20,(char *)local_2e8,0x21)
      ;
      pcVar4 = ", arg=%s, rca=%s, sleepawake=%s, stuff=%s";
      goto LAB_00107618;
    case 6:
      AnalyzerHelpers::GetNumberString
                ((ulong)((uint)(CONCAT44(uStack_354,local_358) >> 0x18) & 0xf),display_base,4,
                 local_318,0x21);
      AnalyzerHelpers::GetNumberString
                (((ulong)uVar3 & 0xff0000) >> 0x10,display_base,0x20,&local_348,0x21);
      AnalyzerHelpers::GetNumberString
                (((ulong)uVar3 & 0xff00) >> 8,display_base,0x20,(char *)local_2e8,0x21);
      AnalyzerHelpers::GetNumberString((ulong)(uVar3 & 0xf),display_base,4,(char *)local_88,0x21);
      sprintf((char *)&local_288,", arg=%s, access=%s, index=%s, value=%s, cmd=%s",local_398,
              local_318,&local_348,local_2e8,local_88);
      AnalyzerResults::AddResultString
                ((char *)this,"CMD",local_2b8,(char *)&local_288,(char *)0x0,(char *)0x0);
      break;
    case 8:
    case 0xb:
    case 0xe:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
      break;
    case 0xc:
    case 0xd:
      AnalyzerHelpers::GetNumberString
                (((ulong)local_358 & 0xff0000) >> 0x10,display_base,0x20,local_318,0x21);
      AnalyzerHelpers::GetNumberString
                (((ulong)uVar3 & 0x1fe) >> 1,display_base,0x20,&local_348,0x21);
      AnalyzerHelpers::GetNumberString((ulong)(uVar3 & 0xf),display_base,4,(char *)local_2e8,0x21);
      pcVar4 = ", arg=%s, rca=%s, stuff=%s, hpi=%s";
LAB_00107618:
      sprintf((char *)&local_288,pcVar4,local_398,local_318,&local_348,local_2e8,ppcVar7);
      break;
    case 0x17:
      uVar5 = CONCAT44(uStack_354,local_358);
      if ((uVar5 & 0x7c0ff0000) != 0x40000000) {
        AnalyzerHelpers::GetNumberString
                  ((ulong)((uint)(uVar5 >> 0x1f) & 0xf),display_base,4,local_318,0x21);
        AnalyzerHelpers::GetNumberString
                  ((ulong)((uint)(uVar5 >> 0x1d) & 0xf),display_base,0x20,&local_348,0x21);
        AnalyzerHelpers::GetNumberString
                  (uVar5 >> 0x19 & 0xff,display_base,0x20,(char *)local_2e8,0x21);
        ppcVar7 = local_88;
        AnalyzerHelpers::GetNumberString
                  ((ulong)((uint)(uVar5 >> 0x18) & 0xf),display_base,4,(char *)ppcVar7,0x21);
        AnalyzerHelpers::GetNumberString((ulong)uVar3 & 0xff,display_base,4,local_58,0x21);
        pcVar4 = ", arg=%s, rwritereq=%s, tagreq=%s, ctx_id=%s, forced=%s, num_blocks=%s";
        goto LAB_00107618;
      }
      AnalyzerHelpers::GetNumberString((ulong)local_358 & 0xff,display_base,0x20,local_58,0x21);
      sprintf((char *)&local_288,", arg=%s, num_blocks=%s",local_398,local_58);
      break;
    default:
      if (lVar1 == 0x26) {
        uVar5 = CONCAT44(uStack_354,local_358);
        AnalyzerHelpers::GetNumberString
                  ((ulong)((uint)(uVar5 >> 0x1f) & 0xf),display_base,4,local_318,0x21);
        AnalyzerHelpers::GetNumberString
                  ((ulong)((uint)(uVar5 >> 0xf) & 0xf),display_base,4,&local_348,0x21);
        AnalyzerHelpers::GetNumberString
                  ((ulong)((uint)(uVar5 >> 1) & 0xf),display_base,4,(char *)local_2e8,0x21);
        ppcVar7 = local_88;
        AnalyzerHelpers::GetNumberString((ulong)(uVar3 & 0xf),display_base,4,(char *)ppcVar7,0x21);
        pcVar4 = ", arg=%s, securereq=%s, forcegarbage=%s, discard_en=%s, ident_writeblocks=%s";
        goto LAB_00107618;
      }
    }
switchD_00106cfc_caseD_2:
    cVar2 = Channel::operator!=(channel,&this->mSettings->mCommandChannel);
    if (cVar2 != '\0') break;
    switch(local_34f) {
    case 1:
      local_288 = local_278;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"");
      uVar3 = (uint)(CONCAT44(uStack_35c,local_360) >> 9) & 0xf;
      if (uVar3 < 0xb) {
        pcVar4 = (&PTR_anon_var_dwarf_4376_0010faf8)[uVar3];
      }
      else {
        pcVar4 = "reserved";
      }
      AnalyzerHelpers::GetNumberString
                (CONCAT44(uStack_35c,local_360),display_base,0x20,local_2b8,0x21);
      AnalyzerResults::AddResultString
                ((char *)this,"R1",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      AnalyzerResults::AddResultString
                ((char *)this,"R1, ",pcVar4,(char *)0x0,(char *)0x0,(char *)0x0);
      AnalyzerResults::AddResultString((char *)this,"R1, ",pcVar4,", rsp=",local_2b8,(char *)0x0);
      uVar5 = CONCAT44(uStack_35c,local_360);
      if ((uVar5 & 0xffffffff80000000) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if (((uint)uVar5 >> 0x1e & 1) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if (((uint)uVar5 >> 0x1d & 1) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if (((uint)uVar5 >> 0x1c & 1) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if (((uint)uVar5 >> 0x1b & 1) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if (((uint)uVar5 >> 0x1a & 1) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if (((uint)uVar5 >> 0x19 & 1) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if (((uint)uVar5 >> 0x18 & 1) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if (((uint)uVar5 >> 0x17 & 1) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if (((uint)uVar5 >> 0x16 & 1) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if (((uint)uVar5 >> 0x15 & 1) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if (((uint)uVar5 >> 0x14 & 1) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if (((uint)uVar5 >> 0x13 & 1) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if (((uint)uVar5 >> 0x12 & 1) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if (((uint)uVar5 >> 0x11 & 1) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if (((uint)uVar5 >> 0x10 & 1) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if ((short)uVar5 < 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if (((uint)uVar5 >> 0xd & 1) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if (((uint)uVar5 >> 8 & 1) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if ((char)uVar5 < '\0') {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if ((uVar5 & 0x40) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if ((uVar5 & 0x20) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if ((uVar5 & 0x10) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if ((uVar5 & 0xc) != 0) {
        std::__cxx11::string::append((char *)&local_288);
        uVar5 = (ulong)local_360;
      }
      if ((uVar5 & 3) != 0) {
        std::__cxx11::string::append((char *)&local_288);
      }
      if (local_280 != 0) {
        AnalyzerResults::AddResultString((char *)this,"R1, ",pcVar4,", rsp=",local_2b8,local_288);
      }
      pcVar4 = local_288;
      if (local_288 == local_278) goto switchD_00107677_default;
      goto LAB_00107f98;
    case 2:
      local_398[0] = local_388;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"R2","");
      AnalyzerResults::AddResultString
                ((char *)this,local_398[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::append((char *)local_398);
      AnalyzerResults::AddResultString
                ((char *)this,local_398[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::append((char *)local_398);
      AnalyzerHelpers::GetNumberString((ulong)uStack_35c,display_base,0x20,(char *)&local_288,0x40);
      std::__cxx11::string::append((char *)local_398);
      std::__cxx11::string::append((char *)local_398);
      AnalyzerHelpers::GetNumberString((ulong)local_360,display_base,0x20,(char *)&local_288,0x40);
      std::__cxx11::string::append((char *)local_398);
      std::__cxx11::string::append((char *)local_398);
      AnalyzerHelpers::GetNumberString((ulong)uStack_354,display_base,0x20,(char *)&local_288,0x40);
      std::__cxx11::string::append((char *)local_398);
      std::__cxx11::string::append((char *)local_398);
      AnalyzerHelpers::GetNumberString((ulong)local_358,display_base,0x20,(char *)&local_288,0x40);
      std::__cxx11::string::append((char *)local_398);
      AnalyzerResults::AddResultString
                ((char *)this,local_398[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      local_348 = (char)uStack_35c;
      local_347 = (undefined1)(local_360 >> 0x18);
      local_346 = (undefined1)(local_360 >> 0x10);
      local_345 = (undefined1)(local_360 >> 8);
      local_344 = (undefined1)local_360;
      local_343 = (undefined1)(uStack_354 >> 0x18);
      local_342 = 0;
      local_2e8[0] = (byte)(uStack_354 >> 0x14) & 0xf | 0x30;
      local_2e8[1] = 0x2e;
      local_2e8[2] = (byte)(uStack_354 >> 0x10) & 0xf | 0x30;
      local_2e5 = 0;
      AnalyzerHelpers::GetNumberString
                (CONCAT44(uStack_354,local_358) >> 0x10 & 0xffffffff,Decimal,0x20,local_318,0xc);
      std::__cxx11::string::append((char *)local_398);
      std::__cxx11::string::append((char *)local_398);
      std::__cxx11::string::append((char *)local_398);
      std::__cxx11::string::append((char *)local_398);
      std::__cxx11::string::append((char *)local_398);
      std::__cxx11::string::append((char *)local_398);
      AnalyzerResults::AddResultString
                ((char *)this,local_398[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      break;
    case 3:
      local_398[0] = local_388;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"R2","");
      AnalyzerResults::AddResultString
                ((char *)this,local_398[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::append((char *)local_398);
      AnalyzerResults::AddResultString
                ((char *)this,local_398[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::append((char *)local_398);
      AnalyzerHelpers::GetNumberString((ulong)uStack_35c,display_base,0x20,(char *)&local_288,0x40);
      std::__cxx11::string::append((char *)local_398);
      std::__cxx11::string::append((char *)local_398);
      AnalyzerHelpers::GetNumberString((ulong)local_360,display_base,0x20,(char *)&local_288,0x40);
      std::__cxx11::string::append((char *)local_398);
      std::__cxx11::string::append((char *)local_398);
      AnalyzerHelpers::GetNumberString((ulong)uStack_354,display_base,0x20,(char *)&local_288,0x40);
      std::__cxx11::string::append((char *)local_398);
      std::__cxx11::string::append((char *)local_398);
      AnalyzerHelpers::GetNumberString((ulong)local_358,display_base,0x20,(char *)&local_288,0x40);
      std::__cxx11::string::append((char *)local_398);
      AnalyzerResults::AddResultString
                ((char *)this,local_398[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      break;
    case 4:
      AnalyzerHelpers::GetNumberString
                (CONCAT44(uStack_35c,local_360),Hexadecimal,0x20,local_2b8,0x21);
      AnalyzerResults::AddResultString
                ((char *)this,"R3",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      AnalyzerResults::AddResultString
                ((char *)this,"R3, ocr=",local_2b8,(char *)0x0,(char *)0x0,(char *)0x0);
      goto switchD_00107677_default;
    case 5:
      pcVar4 = "R4";
      goto LAB_00107ba4;
    case 6:
      pcVar4 = "R5";
LAB_00107ba4:
      AnalyzerResults::AddResultString
                ((char *)this,pcVar4,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    default:
      goto switchD_00107677_default;
    }
    pcVar4 = local_398[0];
    if (local_398[0] != local_388) {
LAB_00107f98:
      operator_delete(pcVar4);
    }
    break;
  case 2:
    goto switchD_00106cfc_caseD_2;
  case 3:
    cVar2 = Channel::operator!=(channel,&this->mSettings->mCommandChannel);
    if (cVar2 == '\0') {
      AnalyzerHelpers::GetNumberString
                (CONCAT44(uStack_35c,local_360),Hexadecimal,7,(char *)&local_288,8);
      AnalyzerResults::AddResultString
                ((char *)this,"CRC",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      AnalyzerResults::AddResultString
                ((char *)this,"CRC=",(char *)&local_288,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    break;
  case 4:
    cVar2 = Channel::operator!=(channel,&this->mSettings->mDataChannel0);
    if (cVar2 == '\0') {
      AnalyzerHelpers::GetNumberString
                (CONCAT44(uStack_35c,local_360),Hexadecimal,8,(char *)&local_288,8);
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&local_288,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    break;
  case 5:
    cVar2 = Channel::operator!=(channel,&this->mSettings->mDataChannel0);
    if (cVar2 == '\0') {
      AnalyzerHelpers::GetNumberString
                (CONCAT44(uStack_35c,local_360),Hexadecimal,8,(char *)&local_288,8);
      AnalyzerResults::AddResultString
                ((char *)this,(char *)&local_288,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    break;
  case 6:
    cVar2 = Channel::operator!=(channel,&this->mSettings->mDataChannel0);
    if (cVar2 != '\0') break;
    pcVar6 = "UNEXPECTED CRC";
    if (CONCAT44(uStack_35c,local_360) == 2) {
      pcVar6 = "GOOD CRC";
    }
    pcVar4 = "BAD CRC";
    if (CONCAT44(uStack_35c,local_360) != 5) {
      pcVar4 = pcVar6;
    }
    goto LAB_0010707f;
  default:
    pcVar4 = "error";
LAB_0010707f:
    AnalyzerResults::AddResultString
              ((char *)this,pcVar4,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
switchD_00107677_default:
  Frame::~Frame(local_370);
  return;
}

Assistant:

void SDMMCAnalyzerResults::GenerateBubbleText(U64 frame_index, Channel& channel, DisplayBase display_base)
{
	ClearResultStrings();
	Frame frame = GetFrame(frame_index);

	switch (frame.mType) {
	case FRAMETYPE_HEADER:
		if (channel != mSettings->mCommandChannel)
			break;
		if (frame.mData1 == 1)
			AddResultString("Host sending");
		else
			AddResultString("Card sending");
		break;

case FRAMETYPE_COMMAND:
	{
		if (channel != mSettings->mCommandChannel)
			break;
		char str_cmd[33];
		char str_arg[33];
		const char *str_desc;
		char str_buf[512];

		AnalyzerHelpers::GetNumberString(frame.mData1, Decimal, 6, str_cmd, sizeof(str_cmd));
		AnalyzerHelpers::GetNumberString(frame.mData2, display_base, 32, str_arg, sizeof(str_arg));

		str_desc = SDMMCHelpers::MMCCommandDescription(frame.mData1, frame.mData2);

		AddResultString("CMD");
		AddResultString("CMD", str_cmd);
		AddResultString("CMD", str_cmd, ", arg=", str_arg, "  ", str_desc);
		AddResultString("CMD", str_cmd, " (", cmd_abbrev_from_number(frame.mData1), "), arg=", str_arg);

		switch (frame.mData1) {
		case 3: //SET_RELATIVE_ADDR
		case 7: //SELECT/DESELECT_CARD
		case 9: //SEND_CSD
		case 10: //SEND_CID
		case 15: //GO_INACTIVE_STATE
		case 55: //APP_CMD
        {
			char str_rca[33];
			char str_stuff[33];

			int rca = (frame.mData2 >> 16) & 0xFF;			//[31:16] RCA
			int stuff = frame.mData2 & 0xFF;				//[15:0] stuff bits

			AnalyzerHelpers::GetNumberString(rca, display_base, 32, str_rca, sizeof(str_rca));
			AnalyzerHelpers::GetNumberString(stuff, display_base, 32, str_stuff, sizeof(str_stuff));

			sprintf(str_buf, ", arg=%s, rca=%s, stuff=%s", str_arg, str_rca, str_stuff);
			break;
        }
		case 4: //SET_DSR
            {
			char str_dsr[33];
			char str_stuff[33];

			int dsr = (frame.mData2 >> 16) & 0xFF;			//[31:16] DSR
			int stuff = frame.mData2 & 0xFF;				//[15:0] stuff bits

			AnalyzerHelpers::GetNumberString(dsr, display_base, 32, str_dsr, sizeof(str_dsr));
			AnalyzerHelpers::GetNumberString(stuff, display_base, 32, str_stuff, sizeof(str_stuff));

			sprintf(str_buf, ", arg=%s, dsr=%s, stuff=%s", str_arg, str_dsr, str_stuff);
			break;}
		case 5: //SLEEP_AWAKE
            {
			char str_rca[33];
			char str_sleepawake[33];
			char str_stuff[33];

			int rca = (frame.mData2 >> 16) & 0xFF;			//[31:16] RCA
			int sleepawake = (frame.mData2 >> 15) & 0xF;	//[15]Sleep/Awake
			int stuff = frame.mData2 & 0xFF;				//[14:0] stuff bits

			AnalyzerHelpers::GetNumberString(rca, display_base, 32, str_rca, sizeof(str_rca));
			AnalyzerHelpers::GetNumberString(sleepawake, display_base, 4, str_sleepawake, sizeof(str_sleepawake));
			AnalyzerHelpers::GetNumberString(stuff, display_base, 32, str_stuff, sizeof(str_stuff));

			sprintf(str_buf, ", arg=%s, rca=%s, sleepawake=%s, stuff=%s", str_arg, str_rca, str_sleepawake, str_stuff);
			break;}
		case 6: //SWITCH
            {
			char str_access[33];
			char str_index[33];
			char str_value[33];
			char str_cmd2[33];

			int access = (frame.mData2 >> 24) & 0xF;   		//[25:24] Access 0=cmd_set 1=set_bits 2=clear_bits 3=write_byte
			int index = (frame.mData2 >> 16) & 0xFF; 		//[23:16] Index
			int value = (frame.mData2 >> 8) & 0xFF;  		//[15:8] Value
			int cmd = frame.mData2 & 0xF;              		//[2:0] Cmd Set

			AnalyzerHelpers::GetNumberString(access, display_base, 4, str_access, sizeof(str_access));
			AnalyzerHelpers::GetNumberString(index, display_base, 32, str_index, sizeof(str_index));
			AnalyzerHelpers::GetNumberString(value, display_base, 32, str_value, sizeof(str_value));
			AnalyzerHelpers::GetNumberString(cmd, display_base, 4, str_cmd2, sizeof(str_cmd2));

			sprintf(str_buf, ", arg=%s, access=%s, index=%s, value=%s, cmd=%s", str_arg, str_access, str_index, str_value, str_cmd2);

			AddResultString("CMD", str_cmd, str_buf);
			break;}
		case 12: //STOP_TRANSMISSION
		case 13: //SEND_STATUS
            {
			char str_rca[33];
			char str_stuff[33];
			char str_hpi[33];

			int rca = (frame.mData2 >> 16) & 0xFF;	//[31:16] RCA
			int stuff = (frame.mData2 >> 1) & 0xFF; //[15:1] stuff bits
			int hpi = frame.mData2 & 0xF;			//[0] HPI

			AnalyzerHelpers::GetNumberString(rca, display_base, 32, str_rca, sizeof(str_rca));
			AnalyzerHelpers::GetNumberString(stuff, display_base, 32, str_stuff, sizeof(str_stuff));
			AnalyzerHelpers::GetNumberString(hpi, display_base, 4, str_hpi, sizeof(str_hpi));

			sprintf(str_buf, ", arg=%s, rca=%s, stuff=%s, hpi=%s", str_arg, str_rca, str_stuff, str_hpi);
			break;}
		case 23: //SET_BLOCK_COUNT
            {
			char str_rwritereq[33];
			char str_tagreq[33];
			char str_ctx_id[33];
			char str_forced[33];
			char str_num_blocks[33];

		// default
			int rwritereq = (frame.mData2 >> 31) & 0xF;	//[31] Reliable Write Request
														//[30] ‘0’ non- packed
			int tagreq = (frame.mData2 >> 29) & 0xF;	//[29] tag request
			int ctx_id = (frame.mData2 >> 25) & 0xFF;	//[28:25] context ID
			int forced = (frame.mData2 >> 24) & 0xF;	//[24]: forced programming
														//[23:16] set to 0
			int num_blocks = frame.mData2 & 0xFF;		//[15:0] number of blocks
		// packed
			int p_zero = (frame.mData2 >> 31) & 0xF;	//[31] set to 0
			int p_one = (frame.mData2 >> 30) & 0xF;		//[30] ‘1’ packed
			int p_zero2 = (frame.mData2 >> 16) & 0xFF;	//[29:16] set to 0
			int num_blocks2 = frame.mData2 & 0xFF;		//[15:0] number of blocks

			if (p_zero == 0 && p_one == 1 && p_zero2 == 0) { // seems packed
				AnalyzerHelpers::GetNumberString(num_blocks2, display_base, 32, str_num_blocks, sizeof(str_num_blocks));

				sprintf(str_buf, ", arg=%s, num_blocks=%s", str_arg, str_num_blocks);

			} else { // has to be default then
				AnalyzerHelpers::GetNumberString(rwritereq, display_base, 4, str_rwritereq, sizeof(str_rwritereq));
				AnalyzerHelpers::GetNumberString(tagreq, display_base, 32, str_tagreq, sizeof(str_tagreq));
				AnalyzerHelpers::GetNumberString(ctx_id, display_base, 32, str_ctx_id, sizeof(str_ctx_id));
				AnalyzerHelpers::GetNumberString(forced, display_base, 4, str_forced, sizeof(str_forced));
				AnalyzerHelpers::GetNumberString(num_blocks, display_base, 4, str_num_blocks, sizeof(str_num_blocks));

				sprintf(str_buf, ", arg=%s, rwritereq=%s, tagreq=%s, ctx_id=%s, forced=%s, num_blocks=%s", str_arg, str_rwritereq, str_tagreq, str_ctx_id, str_forced, num_blocks);
			}
			break;}
		case 38: //ERASE
            {
			char str_securereq[33];
			char str_forcegarb[33];
			char str_discard_en[33];
			char str_ident_writeblocks[33];

			int securereq = (frame.mData2 >> 31) & 0xF;	//[31] Secure request
			//[30:16] set to 0
			int forcegarb = (frame.mData2 >> 15) & 0xF;	//[15] Force Garbage Collect request
			//[14:2] set to 0
			int discard_en = (frame.mData2 >> 1) & 0xF;	//[1] Discard Enable
			int ident_writeblocks = frame.mData2 & 0xF;	//[0] Identify Write Blocks for Erase (or TRIM Enable)

			AnalyzerHelpers::GetNumberString(securereq, display_base, 4, str_securereq, sizeof(str_securereq));
			AnalyzerHelpers::GetNumberString(forcegarb, display_base, 4, str_forcegarb, sizeof(str_forcegarb));
			AnalyzerHelpers::GetNumberString(discard_en, display_base, 4, str_discard_en, sizeof(str_discard_en));
			AnalyzerHelpers::GetNumberString(ident_writeblocks, display_base, 4, str_ident_writeblocks, sizeof(str_ident_writeblocks));

			sprintf(str_buf, ", arg=%s, securereq=%s, forcegarbage=%s, discard_en=%s, ident_writeblocks=%s", str_arg, str_securereq, str_forcegarb, str_discard_en, str_ident_writeblocks);
			break;}
		case 39: //FAST_IO
            {
			char str_rca[33];
			char str_reg_wflag[33];
			char str_reg_addr[33];
			char str_reg_data[33];

			int rca = (frame.mData2 >> 16) & 0xFF;		//[31:16] RCA
			int reg_wflag = (frame.mData2 >> 15) & 0xF;	//[15:15] register write flag
			int reg_addr = (frame.mData2 >> 8) & 0xFF;	//[14:8] register address
			int reg_data = frame.mData2 & 0xFF;			//[7:0] register data

			AnalyzerHelpers::GetNumberString(rca, display_base, 32, str_rca, sizeof(str_rca));
			AnalyzerHelpers::GetNumberString(reg_wflag, display_base, 4, str_reg_wflag, sizeof(str_reg_wflag));
			AnalyzerHelpers::GetNumberString(reg_addr, display_base, 32, str_reg_addr, sizeof(str_reg_addr));
			AnalyzerHelpers::GetNumberString(reg_data, display_base, 32, str_reg_data, sizeof(str_reg_data));

			sprintf(str_buf, ", arg=%s, rca=%s, reg_wflag=%s, reg_addr=%s, reg_data=%s", str_arg, str_rca, str_reg_wflag, str_reg_addr, str_reg_data);
			break;}
		case 53: //PROTOCOL_RD
		case 54: //PROTOCOL_WR
            {
			char str_sec_spec[33];
			char str_sec_prot[33];
			char str_reserv[33];

			int sec_spec = (frame.mData2 >> 16) & 0xFF;	//[16:31] Security Protocol Specific
			int sec_prot = (frame.mData2 >> 8) & 0xFF;	//[15:8] Security Protocol
			int reserv = frame.mData2 & 0xFF;			//[7:0] reserved

			AnalyzerHelpers::GetNumberString(sec_spec, display_base, 32, str_sec_spec, sizeof(str_sec_spec));
			AnalyzerHelpers::GetNumberString(sec_prot, display_base, 32, str_sec_prot, sizeof(str_sec_prot));
			AnalyzerHelpers::GetNumberString(reserv, display_base, 32, str_reserv, sizeof(str_reserv));

			sprintf(str_buf, ", arg=%s, sec_specific=%s, sec_protocol=%s, reserv=%s", str_arg, str_sec_spec, str_sec_prot, str_reserv);
			break;}
		case 56: //GEN_CMD
            {
			char str_stuff[33];
			char str_rd_wr[33];

			int stuff = (frame.mData2 >> 1) & 0xFF;	//[31:1] stuff bits.
			int rd_wr = frame.mData2 & 0xF;			//[0]: RD/WR1

			AnalyzerHelpers::GetNumberString(stuff, display_base, 32, str_stuff, sizeof(str_stuff));
			AnalyzerHelpers::GetNumberString(rd_wr, display_base, 4, str_rd_wr, sizeof(str_rd_wr));

			sprintf(str_buf, ", arg=%s, stuff=%s, rd_wr1=%s", str_arg, str_stuff, str_rd_wr);
			break;}
		}
	}

	case FRAMETYPE_RESPONSE:
	{
		if (channel != mSettings->mCommandChannel)
			break;
		char str_32[33];

		switch (frame.mFlags) {
		case MMC_RSP_R1:
		{
			const char *str_state = "reserved";
			std::string str_flags("");

			switch ((frame.mData1 >> 9) & 0xf) {
			case 0: str_state = "Idle"; break;
			case 1: str_state = "Ready"; break;
			case 2: str_state = "Ident"; break;
			case 3: str_state = "Stby"; break;
			case 4: str_state = "Tran"; break;
			case 5: str_state = "Data"; break;
			case 6: str_state = "Rcv"; break;
			case 7: str_state = "Prg"; break;
			case 8: str_state = "Dis"; break;
			case 9: str_state = "Btst"; break;
			case 10: str_state = "Slp "; break;
			}

			AnalyzerHelpers::GetNumberString(frame.mData1, display_base, 32, str_32, sizeof(str_32));

			AddResultString("R1");
			AddResultString("R1, ", str_state);
			AddResultString("R1, ", str_state, ", rsp=", str_32);

			if (frame.mData1 & (1 << 31))
					str_flags += " ADDRESS_OUT_OF_RANGE";
			if (frame.mData1 & (1 << 30))
					str_flags += " ADDRESS_MISALIGN";
			if (frame.mData1 & (1 << 29))
					str_flags += " BLOCK_LEN_ERROR";
			if (frame.mData1 & (1 << 28))
					str_flags += " ERASE_SEQ_ERROR";
			if (frame.mData1 & (1 << 27))
					str_flags += " ERASE_PARAM";
			if (frame.mData1 & (1 << 26))
					str_flags += " WP_VIOLATION";
			if (frame.mData1 & (1 << 25))
					str_flags += " CARD_IS_LOCKED";
			if (frame.mData1 & (1 << 24))
					str_flags += " LOCK_UNLOCK_FAILED";
			if (frame.mData1 & (1 << 23))
					str_flags += " COM_CRC_ERROR";
			if (frame.mData1 & (1 << 22))
					str_flags += " ILLEGAL_COMMAND";
			if (frame.mData1 & (1 << 21))
					str_flags += " CARD_ECC_FAILED";
			if (frame.mData1 & (1 << 20))
					str_flags += " CC_ERROR";
			if (frame.mData1 & (1 << 19))
					str_flags += " ERROR";
			if (frame.mData1 & (1 << 18))
					str_flags += " UNDERRUN";
			if (frame.mData1 & (1 << 17))
					str_flags += " OVERRUN";
			if (frame.mData1 & (1 << 16))
					str_flags += " CID/CSD_OVERWRITE";
			if (frame.mData1 & (1 << 15))
					str_flags += " WP_ERASE_SKIP";
			if (frame.mData1 & (1 << 13))
					str_flags += " ERASE_RESET";
			if (frame.mData1 & (1 << 8))
					str_flags += " READY_FOR_DATA";
			if (frame.mData1 & (1 << 7))
					str_flags += " SWITCH_ERROR";
			if (frame.mData1 & (1 << 6))
					str_flags += " EXCEPTION_EVENT";
			if (frame.mData1 & (1 << 5))
					str_flags += " APP_CMD";
			if (frame.mData1 & (1 << 4))
					str_flags += " RESERVED";
			if (frame.mData1 & (1 << 3) || frame.mData1 & (1 << 2))
					str_flags += " APP_SPECIFIC";
			if (frame.mData1 & (1 << 1) || frame.mData1 & 1)
					str_flags += " MANUF_TEST";

			if (str_flags.length() > 0)
				AddResultString("R1, ", str_state, ", rsp=", str_32, str_flags.c_str());

			break;
		}
		case MMC_RSP_R2_CID:
		{
			std::string res("R2");
			char pname[7], prv_str[4], psn_str[12];
			char rsp_str[64];

			AddResultString(res.c_str());

			res += " [CID]";
			AddResultString(res.c_str());

			res += " rsp=";
			AnalyzerHelpers::GetNumberString(frame.mData1 >> 32, display_base, 32, rsp_str, sizeof(rsp_str));
			res += rsp_str;
			res += " ";
			AnalyzerHelpers::GetNumberString(frame.mData1 & 0xffffffffull, display_base, 32, rsp_str, sizeof(rsp_str));
			res += rsp_str;
			res += " ";
			AnalyzerHelpers::GetNumberString(frame.mData2 >> 32, display_base, 32, rsp_str, sizeof(rsp_str));
			res += rsp_str;
			res += " ";
			AnalyzerHelpers::GetNumberString(frame.mData2 & 0xffffffffull, display_base, 32, rsp_str, sizeof(rsp_str));
			res += rsp_str;
			AddResultString(res.c_str());

			pname[0] = (frame.mData1 >> 32) & 0xff;
			pname[1] = (frame.mData1 >> 24) & 0xff;
			pname[2] = (frame.mData1 >> 16) & 0xff;
			pname[3] = (frame.mData1 >>  8) & 0xff;
			pname[4] = (frame.mData1 >>  0) & 0xff;
			pname[5] = (frame.mData2 >> 56) & 0xff;
			pname[6] = 0;

			unsigned prv = (unsigned)((frame.mData2 >> 48) & 0xff);
			prv_str[0] = '0' + ((prv >> 4) & 0x0f);
			prv_str[1] = '.';
			prv_str[2] = '0' + (prv & 0x0f);
			prv_str[3] = 0;

			unsigned psn = (unsigned)((frame.mData2 >> 16) & 0xfffffffful);
			AnalyzerHelpers::GetNumberString(psn, Decimal, 32, psn_str, sizeof(psn_str));

			res += " pnm='";
			res += pname;
			res += "' prv=";
			res += prv_str;
			res += " psn=";
			res += psn_str;
			AddResultString(res.c_str());

			break;
		}
		case MMC_RSP_R2_CSD:
		{
			std::string res("R2");
			char rsp_str[64];

			AddResultString(res.c_str());

			res += " [CSD]";
			AddResultString(res.c_str());

			res += " rsp=";
			AnalyzerHelpers::GetNumberString(frame.mData1 >> 32, display_base, 32, rsp_str, sizeof(rsp_str));
			res += rsp_str;
			res += " ";
			AnalyzerHelpers::GetNumberString(frame.mData1 & 0xffffffffull, display_base, 32, rsp_str, sizeof(rsp_str));
			res += rsp_str;
			res += " ";
			AnalyzerHelpers::GetNumberString(frame.mData2 >> 32, display_base, 32, rsp_str, sizeof(rsp_str));
			res += rsp_str;
			res += " ";
			AnalyzerHelpers::GetNumberString(frame.mData2 & 0xffffffffull, display_base, 32, rsp_str, sizeof(rsp_str));
			res += rsp_str;
			AddResultString(res.c_str());

			break;
		}
		case MMC_RSP_R3:
			AnalyzerHelpers::GetNumberString(frame.mData1, Hexadecimal, 32, str_32, sizeof(str_32));
			AddResultString("R3");
			AddResultString("R3, ocr=", str_32);
			break;
		case MMC_RSP_R4:
			AddResultString("R4");
			break;
		case MMC_RSP_R5:
			AddResultString("R5");
			break;
		}
		break;
	}

	case FRAMETYPE_CRC:
	{
		if (channel != mSettings->mCommandChannel)
			break;
		char str_crc[8];

		AnalyzerHelpers::GetNumberString(frame.mData1, Hexadecimal, 7, str_crc, sizeof(str_crc));

		AddResultString("CRC");
		AddResultString("CRC=", str_crc);
		break;
	}

	case FRAMETYPE_DATA_CONTENTS:
	{
		if (channel != mSettings->mDataChannel0)
			break;

		char str_crc[8];
		AnalyzerHelpers::GetNumberString(frame.mData1, Hexadecimal, 8,
				str_crc, sizeof(str_crc));
		AddResultString(str_crc);
		break;
	}
	case FRAMETYPE_DATA_CRC:
	{
		if (channel != mSettings->mDataChannel0)
			break;

		char str_crc[8];
		AnalyzerHelpers::GetNumberString(frame.mData1, Hexadecimal, 8,
				str_crc, sizeof(str_crc));
		AddResultString(str_crc);
		break;
	}

	case FRAMETYPE_DATA_CRC_CHECK:
	{
		if (channel != mSettings->mDataChannel0)
			break;
		if (frame.mData1 == 5) {
			AddResultString("BAD CRC");
		} else {
			if (frame.mData1 == 2) {
				AddResultString("GOOD CRC");
			} else {
				AddResultString("UNEXPECTED CRC");
			}
		}
		break;
	}
	default:
		AddResultString("error");
	}
}